

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O3

void __thiscall ot::commissioner::ProxyClient::SendEmptyChanged(ProxyClient *this,Request *aRequest)

{
  int iVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  Error local_40;
  
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(&local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->mEndpoint).mPeerAddr.mBytes,&local_58);
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = (*aRequest->mEndpoint->_vptr_Endpoint[4])();
  (this->mEndpoint).mPeerPort = (uint16_t)iVar1;
  coap::Coap::SendEmptyChanged(&local_40,&this->mCoap,aRequest);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.mMessage._M_dataplus._M_p != &local_40.mMessage.field_2) {
    operator_delete(local_40.mMessage._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ProxyClient::SendEmptyChanged(const coap::Request &aRequest)
{
    mEndpoint.SetPeerAddr(aRequest.GetEndpoint()->GetPeerAddr());
    mEndpoint.SetPeerPort(aRequest.GetEndpoint()->GetPeerPort());

    IgnoreError(mCoap.SendEmptyChanged(aRequest));
}